

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O2

SDKResult __thiscall
tonk::SDKConnection::Send(SDKConnection *this,void *data,uint64_t bytes,uint32_t channel)

{
  TonkResult TVar1;
  
  if (fp_tonk_send != (fp_tonk_send_t)0x0) {
    TVar1 = (*fp_tonk_send)(this->MyConnection,data,bytes,channel);
    return (SDKResult)TVar1;
  }
  return (SDKResult)Tonk_DLL_Not_Found;
}

Assistant:

TonkResult tonk_send(
    TonkConnection      connection, // Connection to send on
    const void*               data, // Pointer to message data
    uint64_t                 bytes, // Message bytes
    uint32_t               channel  // Channel to attach to message
)
{
    if (!fp_tonk_send) {
        return Tonk_DLL_Not_Found;
    }

    return fp_tonk_send(
        connection,
        data,
        bytes,
        channel);
}